

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStateUpdatePdu.cpp
# Opt level: O1

void __thiscall
DIS::EntityStateUpdatePdu::unmarshal(EntityStateUpdatePdu *this,DataStream *dataStream)

{
  uchar *c;
  pointer *ppVVar1;
  pointer pVVar2;
  pointer pVVar3;
  iterator __position;
  pointer pVVar4;
  ulong uVar5;
  VariableParameter x;
  VariableParameter local_50;
  
  EntityInformationFamilyPdu::unmarshal(&this->super_EntityInformationFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_entityID,dataStream);
  DataStream::operator>>(dataStream,&this->_padding1);
  c = &this->_numberOfVariableParameters;
  DataStream::operator>>(dataStream,c);
  Vector3Float::unmarshal(&this->_entityLinearVelocity,dataStream);
  Vector3Double::unmarshal(&this->_entityLocation,dataStream);
  EulerAngles::unmarshal(&this->_entityOrientation,dataStream);
  DataStream::operator>>(dataStream,&this->_entityAppearance);
  pVVar2 = (this->_variableParameters).
           super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (this->_variableParameters).
           super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar4 = pVVar2;
  if (pVVar3 != pVVar2) {
    do {
      (**pVVar4->_vptr_VariableParameter)(pVVar4);
      pVVar4 = pVVar4 + 1;
    } while (pVVar4 != pVVar3);
    (this->_variableParameters).
    super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  if (*c != '\0') {
    uVar5 = 0;
    do {
      VariableParameter::VariableParameter(&local_50);
      VariableParameter::unmarshal(&local_50,dataStream);
      __position._M_current =
           (this->_variableParameters).
           super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_variableParameters).
          super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<DIS::VariableParameter,std::allocator<DIS::VariableParameter>>::
        _M_realloc_insert<DIS::VariableParameter_const&>
                  ((vector<DIS::VariableParameter,std::allocator<DIS::VariableParameter>> *)
                   &this->_variableParameters,__position,&local_50);
      }
      else {
        (__position._M_current)->_vptr_VariableParameter =
             (_func_int **)&PTR__VariableParameter_001b6670;
        (__position._M_current)->_recordType = local_50._recordType;
        *(undefined7 *)&(__position._M_current)->field_0x9 = local_50._9_7_;
        (__position._M_current)->_variableParameterFields1 =
             (double)CONCAT17(local_50._variableParameterFields1._7_1_,
                              local_50._variableParameterFields1._0_7_);
        *(ulong *)((long)&(__position._M_current)->_variableParameterFields1 + 7) =
             CONCAT71(local_50._24_7_,local_50._variableParameterFields1._7_1_);
        ppVVar1 = &(this->_variableParameters).
                   super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      VariableParameter::~VariableParameter(&local_50);
      uVar5 = uVar5 + 1;
    } while (uVar5 < *c);
  }
  return;
}

Assistant:

void EntityStateUpdatePdu::unmarshal(DataStream& dataStream)
{
    EntityInformationFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _entityID.unmarshal(dataStream);
    dataStream >> _padding1;
    dataStream >> _numberOfVariableParameters;
    _entityLinearVelocity.unmarshal(dataStream);
    _entityLocation.unmarshal(dataStream);
    _entityOrientation.unmarshal(dataStream);
    dataStream >> _entityAppearance;

     _variableParameters.clear();
     for(size_t idx = 0; idx < _numberOfVariableParameters; idx++)
     {
        VariableParameter x;
        x.unmarshal(dataStream);
        _variableParameters.push_back(x);
     }
}